

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O0

int set_archive_flag(char **argv)

{
  char *pcVar1;
  FILE *__stream;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  bool local_21;
  int value;
  int flag;
  char **argv_local;
  
  iVar2 = parse_archive_flag(*argv);
  if (iVar2 < 0) {
    fprintf(_stderr,"invalid archive flag \'%s\'\n",*argv);
    argv_local._4_4_ = -1;
  }
  else {
    iVar3 = strcasecmp(argv[1],"1");
    local_21 = true;
    if (iVar3 != 0) {
      iVar3 = strcasecmp(argv[1],"true");
      local_21 = true;
      if (iVar3 != 0) {
        iVar3 = strcasecmp(argv[1],"yes");
        local_21 = iVar3 == 0;
      }
    }
    iVar2 = zip_set_archive_flag(za,iVar2,(uint)local_21);
    __stream = _stderr;
    if (iVar2 < 0) {
      pcVar1 = *argv;
      uVar4 = zip_strerror(za);
      fprintf(__stream,"can\'t set archive flag \'%s\' to %d: %s\n",pcVar1,(ulong)(uint)local_21,
              uVar4);
      argv_local._4_4_ = -1;
    }
    else {
      argv_local._4_4_ = 0;
    }
  }
  return argv_local._4_4_;
}

Assistant:

static int
set_archive_flag(char *argv[]) {
    int flag = parse_archive_flag(argv[0]);
    if (flag < 0) {
        fprintf(stderr, "invalid archive flag '%s'\n", argv[0]);
        return -1;
    }

    int value = strcasecmp(argv[1], "1") == 0 || strcasecmp(argv[1], "true") == 0 || strcasecmp(argv[1], "yes") == 0;

    if (zip_set_archive_flag(za, flag, value) < 0) {
        fprintf(stderr, "can't set archive flag '%s' to %d: %s\n", argv[0], value, zip_strerror(za));
        return -1;
    }
    return 0;
}